

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEDate.cpp
# Opt level: O0

void __thiscall CEDate::init_members(CEDate *this)

{
  long in_RDI;
  allocator_type *__a;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  size_type in_stack_ffffffffffffffc8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  
  __a = (allocator_type *)&stack0xffffffffffffffd7;
  std::allocator<double>::allocator((allocator<double> *)0x157bfb);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (value_type *)in_stack_ffffffffffffffc0,__a);
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_ffffffffffffffc0,(vector<double,_std::allocator<double>_> *)__a);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffffc0);
  std::allocator<double>::~allocator((allocator<double> *)0x157c3d);
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  *(undefined4 *)(in_RDI + 0x38) = 0;
  return;
}

Assistant:

void CEDate::init_members(void)
{
    gregorian_date_vect_ = std::vector<double>(4, 0.0);
    julian_date_         = 0.0;
    mod_julian_date_     = 0.0;
    gregorian_date_      = 0.0;
    return_type_         = CEDateType::JD ;
}